

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O0

void duckdb::AddUsingBindings
               (UsingColumnSet *set,optional_ptr<duckdb::UsingColumnSet,_true> input_set,
               BindingAlias *input_binding)

{
  bool bVar1;
  UsingColumnSet *pUVar2;
  iterator __x;
  iterator __lhs;
  BindingAlias *entry;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::BindingAlias,_true> *__range2;
  reference in_stack_ffffffffffffffc8;
  optional_ptr<duckdb::UsingColumnSet,_true> *in_stack_ffffffffffffffd0;
  __normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
  in_stack_ffffffffffffffd8;
  vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *in_stack_ffffffffffffffe0;
  vector<duckdb::BindingAlias,_true> *this;
  optional_ptr local_8 [8];
  
  bVar1 = optional_ptr::operator_cast_to_bool(local_8);
  if (bVar1) {
    pUVar2 = optional_ptr<duckdb::UsingColumnSet,_true>::operator->(in_stack_ffffffffffffffd0);
    this = &pUVar2->bindings;
    __x = ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::begin
                    ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)
                     in_stack_ffffffffffffffc8);
    __lhs = ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::end
                      ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)
                       in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
                               *)__lhs._M_current,
                              (__normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
           ::operator*((__normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
                        *)&stack0xffffffffffffffd8);
      ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::push_back
                (&this->super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>,
                 __x._M_current);
      __gnu_cxx::
      __normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
      ::operator++((__normal_iterator<duckdb::BindingAlias_*,_std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>_>
                    *)&stack0xffffffffffffffd8);
    }
  }
  else {
    ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8._M_current);
  }
  return;
}

Assistant:

static void AddUsingBindings(UsingColumnSet &set, optional_ptr<UsingColumnSet> input_set,
                             const BindingAlias &input_binding) {
	if (input_set) {
		for (auto &entry : input_set->bindings) {
			set.bindings.push_back(entry);
		}
	} else {
		set.bindings.push_back(input_binding);
	}
}